

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O0

void cf_gcm_encrypt_final(cf_gcm_ctx *gcmctx,uint8_t *tag,size_t ntag)

{
  uint8_t local_38 [8];
  uint8_t full_tag [16];
  size_t ntag_local;
  uint8_t *tag_local;
  cf_gcm_ctx *gcmctx_local;
  
  memset(local_38,0,0x10);
  ghash_final(&gcmctx->gh,local_38);
  if ((1 < ntag) && (ntag < 0x11)) {
    xor_bb(tag,local_38,gcmctx->e_Y0,ntag);
    mem_clean(local_38,0x10);
    mem_clean(gcmctx,0xb8);
    return;
  }
  abort();
}

Assistant:

void cf_gcm_encrypt_final(cf_gcm_ctx *gcmctx, uint8_t *tag, size_t ntag)
{
  /* Post-process ghash output */
  uint8_t full_tag[16] = { 0 };
  ghash_final(&gcmctx->gh, full_tag);
  
  assert(ntag > 1 && ntag <= 16);
  xor_bb(tag, full_tag, gcmctx->e_Y0, ntag);

  mem_clean(full_tag, sizeof full_tag);
  mem_clean(gcmctx, sizeof *gcmctx);
}